

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O2

void __thiscall Fir1::Fir1(Fir1 *this,double *_coefficients,uint number_of_taps)

{
  double *pdVar1;
  double *__s;
  uint i;
  ulong uVar2;
  
  uVar2 = (ulong)number_of_taps * 8;
  pdVar1 = (double *)operator_new__(uVar2);
  this->coefficients = pdVar1;
  __s = (double *)operator_new__(uVar2);
  memset(__s,0,uVar2);
  this->buffer = __s;
  this->taps = number_of_taps;
  this->offset = 0;
  this->mu = 0.0;
  for (uVar2 = 0; number_of_taps != uVar2; uVar2 = uVar2 + 1) {
    pdVar1[uVar2] = _coefficients[uVar2];
    __s[uVar2] = 0.0;
  }
  return;
}

Assistant:

Fir1::Fir1(const double *_coefficients,const unsigned number_of_taps) :
	coefficients(new double[number_of_taps]),
	buffer(new double[number_of_taps]()),
	taps(number_of_taps) {
	for(unsigned int i=0;i<number_of_taps;i++) {
		coefficients[i] = _coefficients[i];
		buffer[i] = 0;
	}
}